

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketConnection.cpp
# Opt level: O1

ssize_t __thiscall
FIX::ThreadedSocketConnection::read
          (ThreadedSocketConnection *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ssize_t size;
  SocketRecvFailed *pSVar2;
  long lVar3;
  fd_set *pfVar4;
  __fd_mask *p_Var5;
  timeval timeout;
  fd_set readset;
  timeval local_b8;
  __fd_mask local_a8 [16];
  
  local_b8.tv_sec = 1;
  local_b8.tv_usec = 0;
  pfVar4 = &this->m_fds;
  p_Var5 = local_a8;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *p_Var5 = pfVar4->fds_bits[0];
    pfVar4 = (fd_set *)(pfVar4->fds_bits + 1);
    p_Var5 = p_Var5 + 1;
  }
  iVar1 = select(this->m_socket + 1,(fd_set *)local_a8,(fd_set *)0x0,(fd_set *)0x0,&local_b8);
  if (iVar1 < 1) {
    if ((iVar1 == 0) && (this->m_pSession != (Session *)0x0)) {
      Session::next(this->m_pSession);
    }
    else if (iVar1 < 0) {
      pSVar2 = (SocketRecvFailed *)__cxa_allocate_exception(0x50);
      SocketRecvFailed::SocketRecvFailed(pSVar2,(long)iVar1);
      __cxa_throw(pSVar2,&SocketRecvFailed::typeinfo,FIX::Exception::~Exception);
    }
  }
  else {
    size = socket_recv(this->m_socket,this->m_buffer,0x2000);
    if (size < 1) {
      pSVar2 = (SocketRecvFailed *)__cxa_allocate_exception(0x50);
      SocketRecvFailed::SocketRecvFailed(pSVar2,size);
      __cxa_throw(pSVar2,&SocketRecvFailed::typeinfo,FIX::Exception::~Exception);
    }
    std::__cxx11::string::append((char *)&this->m_parser,(ulong)this->m_buffer);
  }
  processStream(this);
  return CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
}

Assistant:

bool ThreadedSocketConnection::read()
{
  struct timeval timeout = { 1, 0 };
  fd_set readset = m_fds;

  try
  {
    // Wait for input (1 second timeout)
    int result = select( 1 + m_socket, &readset, 0, 0, &timeout );

    if( result > 0 ) // Something to read
    {
      // We can read without blocking
      ssize_t size = socket_recv( m_socket, m_buffer, sizeof(m_buffer) );
      if ( size <= 0 ) { throw SocketRecvFailed( size ); }
      m_parser.addToStream( m_buffer, size );
    }
    else if( result == 0 && m_pSession ) // Timeout
    {
      m_pSession->next();
    }
    else if( result < 0 ) // Error
    {
      throw SocketRecvFailed( result );
    }

    processStream();
    return true;
  }
  catch ( SocketRecvFailed& e )
  {
    if( m_disconnect )
      return false;

    if( m_pSession )
    {
      m_pSession->getLog()->onEvent( e.what() );
      m_pSession->disconnect();
    }
    else
    {
      disconnect();
    }

    return false;
  }
}